

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

void us_listen_socket_close(int ssl,us_listen_socket_t *ls)

{
  int iVar1;
  us_socket_t *in_RSI;
  undefined4 in_EDI;
  us_poll_t *unaff_retaddr;
  undefined4 in_stack_fffffffffffffff8;
  
  iVar1 = us_socket_is_closed(0,in_RSI);
  if (iVar1 == 0) {
    us_internal_socket_context_unlink(in_RSI->context,in_RSI);
    us_poll_stop(unaff_retaddr,(us_loop_t *)CONCAT44(in_EDI,in_stack_fffffffffffffff8));
    us_poll_fd(&in_RSI->p);
    bsd_close_socket(0);
    in_RSI->next = (in_RSI->context->loop->data).closed_head;
    (in_RSI->context->loop->data).closed_head = in_RSI;
    in_RSI->prev = (us_socket_t *)in_RSI->context;
  }
  return;
}

Assistant:

void us_listen_socket_close(int ssl, struct us_listen_socket_t *ls) {
    /* us_listen_socket_t extends us_socket_t so we close in similar ways */
    if (!us_socket_is_closed(0, &ls->s)) {
        us_internal_socket_context_unlink(ls->s.context, &ls->s);
        us_poll_stop((struct us_poll_t *) &ls->s, ls->s.context->loop);
        bsd_close_socket(us_poll_fd((struct us_poll_t *) &ls->s));

        /* Link this socket to the close-list and let it be deleted after this iteration */
        ls->s.next = ls->s.context->loop->data.closed_head;
        ls->s.context->loop->data.closed_head = &ls->s;

        /* Any socket with prev = context is marked as closed */
        ls->s.prev = (struct us_socket_t *) ls->s.context;
    }

    /* We cannot immediately free a listen socket as we can be inside an accept loop */
}